

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbox.cpp
# Opt level: O2

void QToolBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      currentChanged((QToolBox *)_o,*_a[1]);
      return;
    case 1:
      piVar3 = (int *)_a[1];
LAB_00476778:
      setCurrentIndex((QToolBox *)_o,*piVar3);
      return;
    case 2:
      setCurrentWidget((QToolBox *)_o,*_a[1]);
      return;
    case 3:
      QToolBoxPrivate::_q_buttonClicked(*(QToolBoxPrivate **)(_o + 8));
      return;
    case 4:
      QToolBoxPrivate::_q_widgetDestroyed(*(QToolBoxPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    piVar3 = (int *)*_a;
    if (_id == 1) {
      *piVar3 = (int)((ulong)(*(long *)(*(long *)(_o + 8) + 0x280) -
                             *(long *)(*(long *)(_o + 8) + 0x278)) >> 3);
    }
    else if (_id == 0) {
      iVar1 = currentIndex((QToolBox *)_o);
      *piVar3 = iVar1;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      piVar3 = (int *)*_a;
      goto LAB_00476778;
    }
    break;
  case IndexOfMethod:
    QtMocHelpers::indexOfMethod<void(QToolBox::*)(int)>
              ((QtMocHelpers *)_a,(void **)currentChanged,0,0);
    return;
  case RegisterMethodArgumentMetaType:
    if (_id == 2) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        return;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
  }
  return;
}

Assistant:

void QToolBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QToolBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 3: _t->d_func()->_q_buttonClicked(); break;
        case 4: _t->d_func()->_q_widgetDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QToolBox::*)(int )>(_a, &QToolBox::currentChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->count(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}